

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Tracks::~Tracks(Tracks *this)

{
  Track **ppTVar1;
  uint32_t i;
  ulong uVar2;
  
  if (this->track_entries_ != (Track **)0x0) {
    for (uVar2 = 0; ppTVar1 = this->track_entries_, uVar2 < this->track_entries_size_;
        uVar2 = uVar2 + 1) {
      if (ppTVar1[uVar2] != (Track *)0x0) {
        (*ppTVar1[uVar2]->_vptr_Track[1])();
      }
    }
    if (ppTVar1 != (Track **)0x0) {
      operator_delete__(ppTVar1);
      return;
    }
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  if (track_entries_) {
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      Track* const track = track_entries_[i];
      delete track;
    }
    delete[] track_entries_;
  }
}